

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SCANCTRL(TT_ExecContext exc,FT_Long *args)

{
  uint uVar1;
  FT_Int A;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = (uint)*args & 0xff;
  if (uVar1 == 0xff) {
    (exc->GS).scan_control = '\x01';
  }
  else if ((*args & 0xffU) == 0) {
    (exc->GS).scan_control = '\0';
  }
  else {
    if (((*args & 0x100U) != 0) && ((exc->tt_metrics).ppem <= uVar1)) {
      (exc->GS).scan_control = '\x01';
    }
    if (((*args & 0x200U) != 0) && ((exc->tt_metrics).rotated != '\0')) {
      (exc->GS).scan_control = '\x01';
    }
    if (((*args & 0x400U) != 0) && ((exc->tt_metrics).stretched != '\0')) {
      (exc->GS).scan_control = '\x01';
    }
    if (((*args & 0x800U) != 0) && (uVar1 < (exc->tt_metrics).ppem)) {
      (exc->GS).scan_control = '\0';
    }
    if (((*args & 0x1000U) != 0) && ((exc->tt_metrics).rotated != '\0')) {
      (exc->GS).scan_control = '\0';
    }
    if (((*args & 0x2000U) != 0) && ((exc->tt_metrics).stretched != '\0')) {
      (exc->GS).scan_control = '\0';
    }
  }
  return;
}

Assistant:

static void
  Ins_SCANCTRL( TT_ExecContext  exc,
                FT_Long*        args )
  {
    FT_Int  A;


    /* Get Threshold */
    A = (FT_Int)( args[0] & 0xFF );

    if ( A == 0xFF )
    {
      exc->GS.scan_control = TRUE;
      return;
    }
    else if ( A == 0 )
    {
      exc->GS.scan_control = FALSE;
      return;
    }

    if ( ( args[0] & 0x100 ) != 0 && exc->tt_metrics.ppem <= A )
      exc->GS.scan_control = TRUE;

    if ( ( args[0] & 0x200 ) != 0 && exc->tt_metrics.rotated )
      exc->GS.scan_control = TRUE;

    if ( ( args[0] & 0x400 ) != 0 && exc->tt_metrics.stretched )
      exc->GS.scan_control = TRUE;

    if ( ( args[0] & 0x800 ) != 0 && exc->tt_metrics.ppem > A )
      exc->GS.scan_control = FALSE;

    if ( ( args[0] & 0x1000 ) != 0 && exc->tt_metrics.rotated )
      exc->GS.scan_control = FALSE;

    if ( ( args[0] & 0x2000 ) != 0 && exc->tt_metrics.stretched )
      exc->GS.scan_control = FALSE;
  }